

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int uv__udp_recv_stop(uv_udp_t *handle)

{
  int iVar1;
  uv_udp_t *handle_local;
  
  uv__io_stop(handle->loop,&handle->io_watcher,1);
  iVar1 = uv__io_active(&handle->io_watcher,4);
  if (((iVar1 == 0) && ((handle->flags & 0x4000) != 0)) &&
     (handle->flags = handle->flags & 0xffffbfff, (handle->flags & 0x2000) != 0)) {
    handle->loop->active_handles = handle->loop->active_handles - 1;
  }
  handle->alloc_cb = (uv_alloc_cb)0x0;
  handle->recv_cb = (uv_udp_recv_cb)0x0;
  return 0;
}

Assistant:

int uv__udp_recv_stop(uv_udp_t* handle) {
  uv__io_stop(handle->loop, &handle->io_watcher, POLLIN);

  if (!uv__io_active(&handle->io_watcher, POLLOUT))
    uv__handle_stop(handle);

  handle->alloc_cb = NULL;
  handle->recv_cb = NULL;

  return 0;
}